

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

int Wlc_PrsPrepare(Wlc_Prs_t *p)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  
  if (p->vLines->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vLines) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x129,"int Wlc_PrsPrepare(Wlc_Prs_t *)");
  }
  pcVar4 = p->pBuffer;
  pcVar7 = pcVar4;
  do {
    if (*pcVar7 == '\n') {
      Vec_IntPush(p->vLines,(int)pcVar4 - *(int *)&p->pBuffer);
    }
    else if (*pcVar7 == '\0') {
      iVar3 = Wlc_PrsRemoveComments(p);
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        if (p->vStarts->nSize != 0) {
          __assert_fail("Vec_IntSize(p->vStarts) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                        ,0x131,"int Wlc_PrsPrepare(Wlc_Prs_t *)");
        }
        pcVar4 = p->pBuffer;
        cVar5 = *pcVar4;
        iVar3 = 1;
        if (cVar5 != '\0') {
          bVar1 = true;
          pcVar7 = pcVar4;
          do {
            if ((bVar1) && (cVar5 == ';')) {
              *pcVar7 = '\0';
              iVar6 = (int)pcVar4 + -1;
              do {
                iVar6 = iVar6 + 1;
                cVar5 = *pcVar4;
                pcVar4 = pcVar4 + 1;
              } while (cVar5 == ' ');
              Vec_IntPush(p->vStarts,iVar6 - *(int *)&p->pBuffer);
              pcVar4 = pcVar7 + 1;
              cVar5 = *pcVar7;
            }
            bVar8 = cVar5 != '\\';
            bVar2 = cVar5 == ' ';
            if (!bVar8) {
              bVar2 = bVar8;
            }
            if (bVar1) {
              bVar2 = bVar8;
            }
            bVar1 = bVar2;
            cVar5 = pcVar7[1];
            pcVar7 = pcVar7 + 1;
          } while (cVar5 != '\0');
        }
      }
      return iVar3;
    }
    pcVar7 = pcVar7 + 1;
    pcVar4 = (char *)(ulong)((int)pcVar4 + 1);
  } while( true );
}

Assistant:

int Wlc_PrsPrepare( Wlc_Prs_t * p )
{
    int fPrettyPrint = 0;
    int fNotName = 1;
    char * pTemp, * pPrev, * pThis;
    // collect info about lines
    assert( Vec_IntSize(p->vLines) == 0 );
    for ( pTemp = p->pBuffer; *pTemp; pTemp++ )
        if ( *pTemp == '\n' )
            Vec_IntPush( p->vLines, pTemp - p->pBuffer );
    // delete comments and insert breaks
    if ( !Wlc_PrsRemoveComments( p ) )
        return 0;
    // collect info about breaks
    assert( Vec_IntSize(p->vStarts) == 0 );
    for ( pPrev = pThis = p->pBuffer; *pThis; pThis++ )
    {
        if ( fNotName && *pThis == ';' )
        {
            *pThis = 0;
            Vec_IntPush( p->vStarts, Wlc_PrsOffset(p, Wlc_PrsSkipSpaces(pPrev)) );
            pPrev = pThis + 1;
        }
        if ( *pThis == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pThis == ' ' )
            fNotName = 1;
    }

    if ( fPrettyPrint )
    {
        int i, k;
        // print the line types
        Wlc_PrsForEachLine( p, pTemp, i )
        {
            if ( Wlc_PrsStrCmp( pTemp, "module" ) )
                printf( "\n" );
            if ( !Wlc_PrsStrCmp( pTemp, "module" ) && !Wlc_PrsStrCmp( pTemp, "endmodule" ) )
                printf( "    " );
            printf( "%c", pTemp[0] );
            for ( k = 1; pTemp[k]; k++ )
                if ( pTemp[k] != ' ' || pTemp[k-1] != ' ' )
                    printf( "%c", pTemp[k] );
            printf( ";\n" );
        }
/*    
        // print the line types
        Wlc_PrsForEachLine( p, pTemp, i )
        {
            int k;  
            if ( !Wlc_PrsStrCmp( pTemp, "module" ) )
                continue;
            printf( "%3d : ", i );
            for ( k = 0; k < 40; k++ )
                printf( "%c", pTemp[k] ? pTemp[k] : ' ' );
            printf( "\n" );
        }
*/
    }
    return 1;
}